

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O2

void Abc_ManTimeStop(Abc_ManTime_t *p)

{
  Vec_Ptr_t *pVVar1;
  
  if (p->tInDrive != (Abc_Time_t *)0x0) {
    free(p->tInDrive);
    p->tInDrive = (Abc_Time_t *)0x0;
  }
  if (p->tOutLoad != (Abc_Time_t *)0x0) {
    free(p->tOutLoad);
    p->tOutLoad = (Abc_Time_t *)0x0;
  }
  pVVar1 = p->vArrs;
  if ((0 < pVVar1->nSize) && (*pVVar1->pArray != (void *)0x0)) {
    free(*pVVar1->pArray);
    *p->vArrs->pArray = (void *)0x0;
    pVVar1 = p->vArrs;
  }
  Vec_PtrFree(pVVar1);
  pVVar1 = p->vReqs;
  if ((0 < pVVar1->nSize) && (*pVVar1->pArray != (void *)0x0)) {
    free(*pVVar1->pArray);
    *p->vReqs->pArray = (void *)0x0;
    pVVar1 = p->vReqs;
  }
  Vec_PtrFree(pVVar1);
  free(p);
  return;
}

Assistant:

void Abc_ManTimeStop( Abc_ManTime_t * p )
{
    if ( p->tInDrive )
        ABC_FREE( p->tInDrive );
    if ( p->tOutLoad )
        ABC_FREE( p->tOutLoad );
    if ( Vec_PtrSize(p->vArrs) > 0 )
        ABC_FREE( p->vArrs->pArray[0] );
    Vec_PtrFree( p->vArrs );
    if ( Vec_PtrSize(p->vReqs) > 0 )
        ABC_FREE( p->vReqs->pArray[0] );
    Vec_PtrFree( p->vReqs );
    ABC_FREE( p );
}